

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O2

void __thiscall PoolResource<144UL,_8UL>::AllocateChunk(PoolResource<144UL,_8UL> *this)

{
  long lVar1;
  byte *pbVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = this->m_available_memory_it;
  uVar3 = (long)this->m_available_memory_end - (long)pbVar2;
  if (uVar3 != 0) {
    uVar3 = uVar3 & 0xfffffffffffffff8;
    *(undefined8 *)pbVar2 = *(undefined8 *)((long)(this->m_free_lists)._M_elems + uVar3);
    *(byte **)((long)(this->m_free_lists)._M_elems + uVar3) = pbVar2;
  }
  pbVar2 = (byte *)operator_new(this->m_chunk_size_bytes,8);
  this->m_available_memory_it = pbVar2;
  this->m_available_memory_end = pbVar2 + this->m_chunk_size_bytes;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::list<std::byte*,std::allocator<std::byte*>>::emplace_back<std::byte*&>
              ((list<std::byte*,std::allocator<std::byte*>> *)&this->m_allocated_chunks,
               &this->m_available_memory_it);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AllocateChunk()
    {
        // if there is still any available memory left, put it into the freelist.
        size_t remaining_available_bytes = std::distance(m_available_memory_it, m_available_memory_end);
        if (0 != remaining_available_bytes) {
            PlacementAddToList(m_available_memory_it, m_free_lists[remaining_available_bytes / ELEM_ALIGN_BYTES]);
        }

        void* storage = ::operator new (m_chunk_size_bytes, std::align_val_t{ELEM_ALIGN_BYTES});
        m_available_memory_it = new (storage) std::byte[m_chunk_size_bytes];
        m_available_memory_end = m_available_memory_it + m_chunk_size_bytes;
        m_allocated_chunks.emplace_back(m_available_memory_it);
    }